

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O0

ostream * operator<<(ostream *os,linkedList<char_*> *rhs)

{
  bool bVar1;
  l_node<char_*> *local_20;
  l_node<char_*> *temp;
  linkedList<char_*> *rhs_local;
  ostream *os_local;
  
  bVar1 = linkedList<char_*>::isEmpty(rhs);
  if (bVar1) {
    std::operator<<(os,"EMPTY LIST\n");
  }
  for (local_20 = rhs->head; local_20 != (l_node<char_*> *)0x0; local_20 = local_20->next) {
    std::operator<<(os,local_20->data);
    if (local_20->next != (l_node<char_*> *)0x0) {
      std::operator<<(os,", ");
    }
  }
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const linkedList<T>& rhs)
{
    if (rhs.isEmpty()){
        os << "EMPTY LIST\n";

    }
    for (l_node<T> *temp = rhs.head; temp != nullptr; temp = temp->next)
    {
        os << temp->data;
        if (temp->next != nullptr)
            os << ", ";
    }
//    os<<"\n";
    return os;
}